

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O3

bool webfront::http::Headers::caseInsensitiveEqual(string_view s1,string_view s2)

{
  char cVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  
  sVar5 = s1._M_len;
  if (sVar5 != s2._M_len) {
    return false;
  }
  if (sVar5 != 0) {
    sVar4 = 0;
    do {
      cVar1 = s2._M_str[sVar4];
      if (s1._M_str[sVar4] != cVar1) {
        iVar2 = toupper((int)s1._M_str[sVar4]);
        iVar3 = toupper((int)cVar1);
        if (iVar2 != iVar3) {
          return false;
        }
      }
      sVar4 = sVar4 + 1;
    } while (sVar5 != sVar4);
  }
  return true;
}

Assistant:

[[nodiscard]] static constexpr bool caseInsensitiveEqual(std::string_view s1, std::string_view s2) {
        return ((s1.size() == s2.size()) && std::equal(s1.begin(), s1.end(), s2.begin(), [](char c1, char c2) {
                    return (c1 == c2 || std::toupper(c1) == std::toupper(c2));
                }));
    }